

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O2

double PhPacker::__phpack__detail::php_pack_parse_double(int is_little_endian,char *src)

{
  ulong uVar1;
  double dVar2;
  
  if (is_little_endian == 0) {
    uVar1 = *(ulong *)src;
    dVar2 = (double)(uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                     (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                     (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                     (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38);
  }
  else {
    dVar2 = *(double *)src;
  }
  return dVar2;
}

Assistant:

double php_pack_parse_double(int is_little_endian, const char* src) noexcept
{
    char out[8] = {};
    if (!is_little_endian) {
        out[0] = src[7];
        out[1] = src[6];
        out[2] = src[5];
        out[3] = src[4];
        out[4] = src[3];
        out[5] = src[2];
        out[6] = src[1];
        out[7] = src[0];
    } else {
        out[0] = src[0];
        out[1] = src[1];
        out[2] = src[2];
        out[3] = src[3];
        out[4] = src[4];
        out[5] = src[5];
        out[6] = src[6];
        out[7] = src[7];
    }
    double d {};
    memcpy(&d, out, sizeof(double));

    return d;
}